

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.cpp
# Opt level: O0

KLVFilePacket * __thiscall
ASDCP::KLVFilePacket::InitFromFile(KLVFilePacket *this,IFileReader *Reader)

{
  byte bVar1;
  int iVar2;
  ui32_t uVar3;
  ILogSink *pIVar4;
  byte_t *pbVar5;
  char *pcVar6;
  IFileReader *in_RDX;
  Result_t local_2c8 [104];
  Result_t local_260 [104];
  int64_t local_1f8;
  fpos_t pos;
  ui32_t local_188;
  uint local_184;
  ui32_t packet_length;
  ui32_t remainder;
  ui64Printer tmp_size_str;
  ui32_t ber_len;
  Result_t local_b8 [8];
  Result_t result;
  uint local_50;
  undefined4 uStack_4c;
  ui64_t tmp_size;
  byte_t tmp_data [32];
  ui32_t read_count;
  IFileReader *Reader_local;
  KLVFilePacket *this_local;
  
  *(undefined8 *)(Reader + 0x18) = 0;
  *(undefined8 *)(Reader + 8) = 0;
  *(undefined8 *)(Reader + 0x20) = 0;
  *(undefined4 *)(Reader + 0x10) = 0;
  FrameBuffer::Size((FrameBuffer *)(Reader + 0x48),0);
  (**(code **)(*(long *)in_RDX + 0x38))(local_b8,in_RDX,&tmp_size,0x20,tmp_data + 0x1c);
  iVar2 = Kumu::Result_t::operator_cast_to_int(local_b8);
  if (iVar2 < 0) {
    Kumu::Result_t::Result_t((Result_t *)this,local_b8);
  }
  else if ((uint)tmp_data._28_4_ < 0x11) {
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (pIVar4,"Short read of Key and Length got %u\n",(ulong)(uint)tmp_data._28_4_);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_READFAIL);
  }
  else if (CONCAT13(tmp_size._3_1_,CONCAT12(tmp_size._2_1_,CONCAT11(tmp_size._1_1_,(byte)tmp_size)))
           == 0x342b0e06) {
    bVar1 = Kumu::read_BER(tmp_data + 8,(ulonglong *)&local_50);
    if ((bVar1 & 1) == 0) {
      pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar4,"BER Length decoding error\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
    }
    else {
      uVar3 = Kumu::BER_length(tmp_data + 8);
      *(ui32_t *)(Reader + 0x10) = uVar3 + 0x10;
      if (CONCAT44(uStack_4c,local_50) < 0x4000001) {
        local_184 = 0;
        if (0xffffffff < CONCAT44(uStack_4c,local_50)) {
          __assert_fail("tmp_size <= 0xFFFFFFFFL",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KLV.cpp"
                        ,0x101,
                        "virtual ASDCP::Result_t ASDCP::KLVFilePacket::InitFromFile(const Kumu::IFileReader &)"
                       );
        }
        *(ulong *)(Reader + 0x20) = (ulong)local_50;
        local_188 = *(int *)(Reader + 0x20) + *(int *)(Reader + 0x10);
        FrameBuffer::Capacity((FrameBuffer *)&pos,(int)Reader + 0x48);
        Kumu::Result_t::operator=(local_b8,(Result_t *)&pos);
        Kumu::Result_t::~Result_t((Result_t *)&pos);
        iVar2 = Kumu::Result_t::operator_cast_to_int(local_b8);
        if (iVar2 < 0) {
          Kumu::Result_t::Result_t((Result_t *)this,local_b8);
        }
        else {
          pbVar5 = FrameBuffer::Data((FrameBuffer *)(Reader + 0x48));
          *(byte_t **)(Reader + 8) = pbVar5;
          pbVar5 = FrameBuffer::Data((FrameBuffer *)(Reader + 0x48));
          *(byte_t **)(Reader + 0x18) = pbVar5 + *(uint *)(Reader + 0x10);
          FrameBuffer::Size((FrameBuffer *)(Reader + 0x48),local_188);
          if (local_188 < 0x21) {
            if ((uint)tmp_data._28_4_ < local_188) {
              __assert_fail("packet_length <= read_count",
                            "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KLV.cpp"
                            ,0x111,
                            "virtual ASDCP::Result_t ASDCP::KLVFilePacket::InitFromFile(const Kumu::IFileReader &)"
                           );
            }
            pbVar5 = FrameBuffer::Data((FrameBuffer *)(Reader + 0x48));
            memcpy(pbVar5,&tmp_size,(ulong)local_188);
            local_184 = tmp_data._28_4_ - local_188;
            if (local_184 != 0) {
              pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
              Kumu::ILogSink::Warn(pIVar4,"Repositioning pointer for short packet\n");
              local_1f8 = Kumu::IFileReader::TellPosition(in_RDX);
              if (local_1f8 <= (long)(ulong)local_184) {
                __assert_fail("pos > remainder",
                              "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KLV.cpp"
                              ,0x118,
                              "virtual ASDCP::Result_t ASDCP::KLVFilePacket::InitFromFile(const Kumu::IFileReader &)"
                             );
              }
              (**(code **)(*(long *)in_RDX + 0x28))(local_260,in_RDX,local_1f8 - (ulong)local_184,0)
              ;
              Kumu::Result_t::operator=(local_b8,local_260);
              Kumu::Result_t::~Result_t(local_260);
            }
          }
          else {
            if ((uint)tmp_data._28_4_ < 0x20) {
              pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
              uVar3 = FrameBuffer::Size((FrameBuffer *)(Reader + 0x48));
              Kumu::ILogSink::Error
                        (pIVar4,"Short read of packet body, expecting %u, got %u\n",(ulong)uVar3,
                         (ulong)(uint)tmp_data._28_4_);
              Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_READFAIL);
              goto LAB_00229d09;
            }
            pbVar5 = FrameBuffer::Data((FrameBuffer *)(Reader + 0x48));
            *(undefined8 *)(pbVar5 + 0x10) = tmp_data._8_8_;
            *(undefined8 *)(pbVar5 + 0x18) = tmp_data._16_8_;
            *(ulong *)pbVar5 =
                 CONCAT44(tmp_size._4_4_,
                          CONCAT13(tmp_size._3_1_,
                                   CONCAT12(tmp_size._2_1_,CONCAT11(tmp_size._1_1_,(byte)tmp_size)))
                         );
            *(undefined8 *)(pbVar5 + 8) = tmp_data._0_8_;
            uVar3 = FrameBuffer::Size((FrameBuffer *)(Reader + 0x48));
            local_184 = uVar3 - 0x20;
            if (local_184 != 0) {
              pbVar5 = FrameBuffer::Data((FrameBuffer *)(Reader + 0x48));
              (**(code **)(*(long *)in_RDX + 0x38))
                        (local_2c8,in_RDX,pbVar5 + 0x20,local_184,tmp_data + 0x1c);
              Kumu::Result_t::operator=(local_b8,local_2c8);
              Kumu::Result_t::~Result_t(local_2c8);
              if (tmp_data._28_4_ != local_184) {
                pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
                Kumu::ILogSink::Error
                          (pIVar4,"Short read of packet body, expecting %u, got %u\n",
                           (ulong)(local_184 + 0x20),(ulong)(tmp_data._28_4_ + 0x20));
                Kumu::Result_t::operator=(local_b8,(Result_t *)Kumu::RESULT_READFAIL);
              }
            }
          }
          Kumu::Result_t::Result_t((Result_t *)this,local_b8);
        }
      }
      else {
        (**(code **)(*(long *)in_RDX + 0x28))
                  (tmp_size_str.super_IntPrinter<unsigned_long_long,_32>.m_strbuf + 0x18,in_RDX,
                   CONCAT44(uStack_4c,local_50) - (ulong)(0x10 - uVar3));
        Kumu::Result_t::operator=
                  (local_b8,(Result_t *)
                            (tmp_size_str.super_IntPrinter<unsigned_long_long,_32>.m_strbuf + 0x18))
        ;
        Kumu::Result_t::~Result_t
                  ((Result_t *)
                   (tmp_size_str.super_IntPrinter<unsigned_long_long,_32>.m_strbuf + 0x18));
        iVar2 = Kumu::Result_t::operator_cast_to_int(local_b8);
        if (-1 < iVar2) {
          pbVar5 = FrameBuffer::Data((FrameBuffer *)(Reader + 0x48));
          *(ulong *)pbVar5 =
               CONCAT44(tmp_size._4_4_,
                        CONCAT13(tmp_size._3_1_,
                                 CONCAT12(tmp_size._2_1_,CONCAT11(tmp_size._1_1_,(byte)tmp_size))));
          *(undefined8 *)(pbVar5 + 8) = tmp_data._0_8_;
          pbVar5 = FrameBuffer::Data((FrameBuffer *)(Reader + 0x48));
          *(byte_t **)(Reader + 8) = pbVar5;
          Kumu::ui64Printer::ui64Printer((ui64Printer *)&packet_length,CONCAT44(uStack_4c,local_50))
          ;
          pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
          pcVar6 = Kumu::IntPrinter<unsigned_long_long,_32>::c_str
                             ((IntPrinter<unsigned_long_long,_32> *)&packet_length);
          Kumu::ILogSink::Error(pIVar4,"Packet length %s exceeds internal limit.\n",pcVar6);
          Kumu::Result_t::operator=(local_b8,(Result_t *)Kumu::RESULT_ALLOC);
          Kumu::ui64Printer::~ui64Printer((ui64Printer *)&packet_length);
        }
        Kumu::Result_t::Result_t((Result_t *)this,local_b8);
      }
    }
  }
  else {
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (pIVar4,"Unexpected UL preamble: %02x.%02x.%02x.%02x\n",(ulong)(byte)tmp_size,
               (ulong)tmp_size._1_1_,(ulong)tmp_size._2_1_,(ulong)tmp_size._3_1_);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
  }
LAB_00229d09:
  Kumu::Result_t::~Result_t(local_b8);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::KLVFilePacket::InitFromFile(const Kumu::IFileReader& Reader)
{
  ui32_t read_count;
  byte_t tmp_data[tmp_read_size];
  ui64_t tmp_size;
  m_KeyStart = m_ValueStart = 0;
  m_KLLength = m_ValueLength = 0;
  m_Buffer.Size(0);

  Result_t result = Reader.Read(tmp_data, tmp_read_size, &read_count);

  if ( ASDCP_FAILURE(result) )
    return result;

  if ( read_count < (SMPTE_UL_LENGTH + 1) )
    {
      DefaultLogSink().Error("Short read of Key and Length got %u\n", read_count);
      return RESULT_READFAIL;
    }

  if ( memcmp(tmp_data, SMPTE_UL_START, 4) != 0 )
    {
      DefaultLogSink().Error("Unexpected UL preamble: %02x.%02x.%02x.%02x\n",
			     tmp_data[0], tmp_data[1], tmp_data[2], tmp_data[3]);
      return RESULT_FAIL;
    }

  if ( ! Kumu::read_BER(tmp_data + SMPTE_UL_LENGTH, &tmp_size) )
    {
      DefaultLogSink().Error("BER Length decoding error\n");
      return RESULT_FAIL;
    }

  ui32_t ber_len = Kumu::BER_length(tmp_data + SMPTE_UL_LENGTH);
  m_KLLength = SMPTE_UL_LENGTH + ber_len;

  if ( tmp_size > MAX_KLV_PACKET_LENGTH )
    {
      result = Reader.Seek(tmp_size - (tmp_read_size - SMPTE_UL_LENGTH - ber_len), Kumu::SP_POS);

      if ( ASDCP_SUCCESS(result) )
        {
          memcpy(m_Buffer.Data(), tmp_data, SMPTE_UL_LENGTH);
          m_KeyStart = m_Buffer.Data();

          Kumu::ui64Printer tmp_size_str(tmp_size);
          DefaultLogSink().Error("Packet length %s exceeds internal limit.\n", tmp_size_str.c_str());
          result = RESULT_ALLOC;
        }

      return result;
    }

  ui32_t remainder = 0;
  assert(tmp_size <= 0xFFFFFFFFL);
  m_ValueLength = (ui32_t) tmp_size;
  ui32_t packet_length = m_ValueLength + m_KLLength;

  result = m_Buffer.Capacity(packet_length);

  if ( ASDCP_FAILURE(result) )
    return result;

  m_KeyStart = m_Buffer.Data();
  m_ValueStart = m_Buffer.Data() + m_KLLength;
  m_Buffer.Size(packet_length);

  // is the whole packet in the tmp buf?
  if ( packet_length <= tmp_read_size )
    {
      assert(packet_length <= read_count);
      memcpy(m_Buffer.Data(), tmp_data, packet_length);

      if ( (remainder = read_count - packet_length) != 0 )
	{
	  DefaultLogSink().Warn("Repositioning pointer for short packet\n");
	  Kumu::fpos_t pos = Reader.TellPosition();
	  assert(pos > remainder);
	  result = Reader.Seek(pos - remainder);
	}
    }
  else
    {
      if ( read_count < tmp_read_size )
	{
	  DefaultLogSink().Error("Short read of packet body, expecting %u, got %u\n",
				 m_Buffer.Size(), read_count);
	  return RESULT_READFAIL;
	}

      memcpy(m_Buffer.Data(), tmp_data, tmp_read_size);
      remainder = m_Buffer.Size() - tmp_read_size;

      if ( remainder > 0 )
	{
	  result = Reader.Read(m_Buffer.Data() + tmp_read_size, remainder, &read_count);
      
	  if ( read_count != remainder )
	    {
	      DefaultLogSink().Error("Short read of packet body, expecting %u, got %u\n",
				     remainder+tmp_read_size, read_count+tmp_read_size);
	      result = RESULT_READFAIL;
	    }
	}
    }

  return result;
}